

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode cf_h2_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  undefined8 uVar1;
  cf_call_data save;
  CURLcode result;
  void *arg2_local;
  int arg1_local;
  int event_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  save.data._4_4_ = CURLE_OK;
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x10);
  *(Curl_easy **)((long)cf->ctx + 0x10) = data;
  switch(event) {
  case 2:
    http2_data_done(cf,data,true);
    break;
  default:
    break;
  case 4:
    break;
  case 6:
    save.data._4_4_ = http2_data_pause(cf,data,arg1 != 0);
    break;
  case 7:
    http2_data_done(cf,data,arg1 != 0);
    break;
  case 8:
    save.data._4_4_ = http2_data_done_send(cf,data);
  }
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar1;
  return save.data._4_4_;
}

Assistant:

static CURLcode cf_h2_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  struct cf_call_data save;

  (void)arg2;

  CF_DATA_SAVE(save, cf, data);
  switch(event) {
  case CF_CTRL_DATA_SETUP:
    break;
  case CF_CTRL_DATA_PAUSE:
    result = http2_data_pause(cf, data, (arg1 != 0));
    break;
  case CF_CTRL_DATA_DONE_SEND:
    result = http2_data_done_send(cf, data);
    break;
  case CF_CTRL_DATA_DETACH:
    http2_data_done(cf, data, TRUE);
    break;
  case CF_CTRL_DATA_DONE:
    http2_data_done(cf, data, arg1 != 0);
    break;
  default:
    break;
  }
  CF_DATA_RESTORE(cf, save);
  return result;
}